

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,ReturnStmt *stmt)

{
  process_stmt(this,&stmt->super_Stmt);
  return;
}

Assistant:

void visit(ReturnStmt *stmt) override { process_stmt(stmt); }